

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O0

int CfdGetConfidentialValueHex
              (void *handle,int64_t value_satoshi,bool ignore_version_info,char **value_hex)

{
  undefined8 uVar1;
  char *pcVar2;
  undefined8 *in_RCX;
  byte in_DL;
  int64_t in_RSI;
  CfdException *except;
  exception *std_except;
  string hex_str;
  ConfidentialValue value;
  Amount amount;
  int result;
  string *in_stack_fffffffffffffee0;
  CfdException *this;
  string local_f8 [32];
  string local_d8 [8];
  string *in_stack_ffffffffffffff30;
  ConfidentialValue local_b8;
  Amount local_90;
  undefined1 local_7a;
  undefined1 local_79 [33];
  CfdSourceLocation local_58;
  undefined4 local_2c;
  undefined8 *local_28;
  byte local_19;
  int64_t local_18;
  int local_4;
  
  local_19 = in_DL & 1;
  local_2c = 0xffffffff;
  local_28 = in_RCX;
  local_18 = in_RSI;
  cfd::Initialize();
  if (local_28 == (undefined8 *)0x0) {
    local_58.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                 ,0x2f);
    local_58.filename = local_58.filename + 1;
    local_58.line = 0x8c2;
    local_58.funcname = "CfdGetConfidentialValueHex";
    cfd::core::logger::warn<>(&local_58,"value_hex is null.");
    local_7a = 1;
    uVar1 = __cxa_allocate_exception(0x30);
    this = (CfdException *)local_79;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_79 + 1),"Failed to parameter. value_hex is null.",(allocator *)this)
    ;
    cfd::core::CfdException::CfdException
              (this,(CfdError)((ulong)uVar1 >> 0x20),in_stack_fffffffffffffee0);
    local_7a = 0;
    __cxa_throw(uVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  cfd::core::Amount::Amount(&local_90,local_18);
  cfd::core::ConfidentialValue::ConfidentialValue(&local_b8,&local_90);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_((string *)local_d8,&local_b8);
  if ((local_19 & 1) != 0) {
    std::__cxx11::string::substr((ulong)local_f8,(ulong)local_d8);
    std::__cxx11::string::operator=(local_d8,local_f8);
    std::__cxx11::string::~string(local_f8);
  }
  pcVar2 = cfd::capi::CreateString(in_stack_ffffffffffffff30);
  *local_28 = pcVar2;
  local_4 = 0;
  std::__cxx11::string::~string(local_d8);
  cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x5ba2de);
  return local_4;
}

Assistant:

int CfdGetConfidentialValueHex(
    void* handle, int64_t value_satoshi, bool ignore_version_info,
    char** value_hex) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (value_hex == nullptr) {
      warn(CFD_LOG_SOURCE, "value_hex is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. value_hex is null.");
    }
    Amount amount(value_satoshi);
    ConfidentialValue value(amount);
    std::string hex_str = value.GetHex();

    if (ignore_version_info) {  // erase first 1byte (2 char)
      hex_str = hex_str.substr(2);
    }
    *value_hex = CreateString(hex_str);

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}